

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SpanTest_Accessor_Test::~SpanTest_Accessor_Test(SpanTest_Accessor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SpanTest, Accessor) {
  std::vector<int> v({42, 23, 5, 101, 80});
  Span<int> s(v);
  for (size_t i = 0; i < s.size(); ++i) {
    EXPECT_EQ(s[i], v[i]);
    EXPECT_EQ(s.at(i), v.at(i));
  }
  EXPECT_EQ(s.begin(), v.data());
  EXPECT_EQ(s.end(), v.data() + v.size());
}